

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_heap.c
# Opt level: O1

void vmcache_free(heap *heap,ptr_ext_t *first_extent)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  undefined1 local_50 [8];
  heap_entry he;
  extent ext;
  
  iVar1 = os_mutex_lock(&heap->lock);
  if (iVar1 != 0) {
    piVar3 = __errno_location();
    *piVar3 = iVar1;
    abort();
  }
  if (first_extent == (ptr_ext_t *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar5 = 0;
    sVar4 = *(size_t *)(first_extent + -0x18);
    uVar7 = *(ulong *)(first_extent + -8) & 0x7fffffffffffffff;
    he.size = (size_t)first_extent;
    do {
      sVar6 = sVar4;
      vmcache_heap_merge(heap,(extent *)&he.size,(heap_entry *)local_50);
      *(ptr_ext_t **)local_50 = heap->first_extent;
      *(ptr_ext_t **)((long)local_50 + 8) = (ptr_ext_t *)0x0;
      *(uint64_t **)((long)local_50 + 0x10) = &he.ptr[-2].size_flags;
      *(uint64_t **)((long)&((header *)((long)local_50 + -0x18))->size_flags + (long)he.ptr) =
           &he.ptr[-2].size_flags;
      if (heap->first_extent != (ptr_ext_t *)0x0) {
        *(header **)(heap->first_extent + -0x10) = (header *)((long)local_50 + 0x18);
      }
      heap->first_extent = (ptr_ext_t *)((long)local_50 + 0x18);
      heap->entries = heap->entries + 1;
      if (sVar6 == 0) {
        uVar2 = 0;
        sVar4 = 0;
      }
      else {
        uVar2 = *(ulong *)(sVar6 - 8) & 0x7fffffffffffffff;
        sVar4 = *(size_t *)(sVar6 - 0x18);
      }
      lVar5 = lVar5 + uVar7;
      uVar7 = uVar2;
      he.size = sVar6;
    } while (sVar6 != 0);
  }
  he.size = 0;
  heap->size_used = heap->size_used - lVar5;
  iVar1 = os_mutex_unlock(&heap->lock);
  if (iVar1 == 0) {
    return;
  }
  piVar3 = __errno_location();
  *piVar3 = iVar1;
  abort();
}

Assistant:

void
vmcache_free(struct heap *heap, ptr_ext_t *first_extent)
{
	LOG(3, "heap %p first_extent %p", heap, first_extent);

	util_mutex_lock(&heap->lock);

	size_t freed = 0;

	/*
	 * EXTENTS_FOREACH_SAFE variant is required here,
	 * because vmcache_insert_heap_entry() can modify
	 * the headers of the 'ext' extent.
	 */
	ptr_ext_t *__next;
	struct extent ext;
	EXTENTS_FOREACH_SAFE(ext, first_extent, __next) {
		/* size without headers */
		freed += ext.size;

		struct heap_entry he;
		vmcache_heap_merge(heap, &ext, &he);
		vmcache_insert_heap_entry(heap,
					&he, &heap->first_extent, IS_FREE);
	}

#ifdef STATS_ENABLED
	heap->size_used -= freed;
#endif

	util_mutex_unlock(&heap->lock);
}